

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void Logger::Log(size_t level,string *msg)

{
  char *pcVar1;
  unsigned_long *puVar2;
  tm *__tp;
  ostream *poVar3;
  char local_58 [8];
  char dateTime [28];
  char *category;
  time_t local_20;
  time_t tt;
  string *msg_local;
  size_t level_local;
  
  if (logLevel <= level) {
    tt = (time_t)msg;
    msg_local = (string *)level;
    category = (char *)std::chrono::_V2::system_clock::now();
    local_20 = std::chrono::_V2::system_clock::to_time_t((time_point *)&category);
    stack0xffffffffffffffc8 = 4;
    puVar2 = std::min<unsigned_long>((unsigned_long *)&msg_local,(unsigned_long *)(dateTime + 0x18))
    ;
    pcVar1 = CATEGORY[*puVar2];
    __tp = localtime(&local_20);
    strftime(local_58,0x1c,"%FT%T%z ",__tp);
    poVar3 = std::operator<<((ostream *)&std::cerr,local_58);
    poVar3 = std::operator<<(poVar3,pcVar1);
    poVar3 = std::operator<<(poVar3,(string *)tt);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Logger::Log(const size_t level, const std::string& msg)
{
    if (level >= logLevel) {
        std::time_t tt = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
        const auto category = CATEGORY[std::min(level, sizeof(CATEGORY) / sizeof(CATEGORY[0]))];
        char dateTime[28];

        //TODO use std::put_time() when available
        TIME_T_TO_STRING(dateTime, &tt);
        std::cerr << dateTime << category << msg << std::endl;
    }
}